

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

method_base * __thiscall
cs::translator_type::match
          (translator_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  bool bVar1;
  size_type sVar2;
  compile_error *pcVar3;
  _List_node_base *p_Var4;
  iterator __end2;
  allocator local_59;
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  stack;
  string local_40;
  
  sVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(raw);
  if (sVar2 < 2) {
    pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_40,"Empty input when matching grammar.",(allocator *)&stack);
    compile_error::compile_error(pcVar3,&local_40);
    __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  stack.
  super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var4 = (_List_node_base *)this;
  stack.
  super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&stack;
  stack.
  super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&stack;
  while (p_Var4 = (((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                     *)&p_Var4->_M_next)->
                  super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next, p_Var4 != (_List_node_base *)this
        ) {
    bVar1 = compare((token_base *)**(undefined8 **)(*(long *)(p_Var4 + 1) + 0x10),
                    *(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                     _M_impl.super__Deque_impl_data._M_start._M_cur);
    if (bVar1) {
      std::__cxx11::
      list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
      ::push_back(&stack,(value_type *)(p_Var4 + 1));
    }
  }
  std::__cxx11::
  list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
  ::
  remove_if<cs::translator_type::match(std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&)::_lambda(std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>const&)_1_>
            ((list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
              *)&stack,(anon_class_8_1_ba1d7388)raw);
  std::__cxx11::
  list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
  ::
  remove_if<cs::translator_type::match(std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&)::_lambda(std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>const&)_2_>
            ((list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
              *)&stack,(anon_class_8_1_ba1d7388)raw);
  if (stack.
      super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&stack) {
    if (stack.
        super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
        ._M_impl._M_node._M_size < 2) {
      p_Var4 = stack.
               super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[5]._M_next;
      std::__cxx11::
      _List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
      ::_M_clear(&stack.
                  super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                );
      return (method_base *)p_Var4;
    }
    pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_40,"Ambiguous grammar.",&local_59);
    compile_error::compile_error(pcVar3,&local_40);
    __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_40,"Unknown grammar.",&local_59);
  compile_error::compile_error(pcVar3,&local_40);
  __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

method_base *match(const std::deque<token_base *> &raw)
		{
			if (raw.size() <= 1)
				throw compile_error("Empty input when matching grammar.");
			std::list<std::shared_ptr<data_type>> stack;
			for (auto &it: m_data)
				if (cs::translator_type::compare(it->first.front(), raw.front()))
					stack.push_back(it);
			stack.remove_if([&](const std::shared_ptr<data_type> &dat) {
				return dat->first.size() != raw.size();
			});
			stack.remove_if([&](const std::shared_ptr<data_type> &dat) {
				for (std::size_t i = 1; i < raw.size() - 1; ++i) {
					if (!compare(raw.at(i), dat->first.at(i)))
						return true;
				}
				return false;
			});
			if (stack.empty())
				throw compile_error("Unknown grammar.");
			if (stack.size() > 1)
				throw compile_error("Ambiguous grammar.");
			return stack.front()->second;
		}